

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::TaskSet::~TaskSet(TaskSet *this)

{
  AsyncObject *this_00;
  
  destroyTasks(this);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&(this->emptyFulfiller).ptr);
  this_00 = (AsyncObject *)&this->tasks;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)this_00);
  AsyncObject::~AsyncObject(this_00);
  return;
}

Assistant:

TaskSet::~TaskSet() noexcept(false) {
  destroyTasks();
}